

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitRefTest(BinaryInstWriter *this,RefTest *curr)

{
  WasmBinaryWriter *this_00;
  bool bVar1;
  HeapType type;
  
  BufferWithRandomAccess::operator<<(this->o,-5);
  bVar1 = wasm::Type::isNullable(&curr->castType);
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)((uint)bVar1 * 8 + 0x40));
  this_00 = this->parent;
  type = wasm::Type::getHeapType(&curr->castType);
  WasmBinaryWriter::writeHeapType(this_00,type);
  return;
}

Assistant:

void BinaryInstWriter::visitRefTest(RefTest* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  if (curr->castType.isNullable()) {
    o << U32LEB(BinaryConsts::RefTestNull);
  } else {
    o << U32LEB(BinaryConsts::RefTest);
  }
  parent.writeHeapType(curr->castType.getHeapType());
}